

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void av1_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  bool bVar8;
  int8_t *piVar9;
  uint uVar10;
  long lVar11;
  undefined7 in_register_00000009;
  undefined1 (*pauVar12) [16];
  int iVar13;
  undefined1 (*pauVar14) [16];
  uint uVar15;
  undefined1 (*pauVar16) [16];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  __m256i out [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  piVar9 = av1_fwd_txfm_shift_ls[7];
  uVar23 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  bVar25 = tx_type < 0x10;
  uVar15 = 0xbeaf >> (tx_type & 0x1f);
  uVar10 = 0x7f1f >> (tx_type & 0x1f);
  pauVar12 = (undefined1 (*) [16])(input + stride * 8);
  iVar13 = stride * 2;
  bVar8 = (uVar15 & 1) != 0;
  pauVar14 = pauVar12;
  if (bVar8 || !bVar25) {
    pauVar14 = (undefined1 (*) [16])input;
  }
  iVar17 = stride * 6;
  iVar6 = stride;
  if (bVar8 || !bVar25) {
    iVar17 = stride;
    iVar6 = stride * 6;
  }
  iVar19 = stride * 5;
  iVar7 = iVar13;
  if (bVar8 || !bVar25) {
    iVar19 = iVar13;
    iVar7 = stride * 5;
  }
  iVar18 = stride * 4;
  iVar22 = iVar18;
  if (bVar8 || !bVar25) {
    iVar22 = stride * 3;
  }
  iVar20 = stride * 3;
  if (bVar8 || !bVar25) {
    iVar20 = iVar18;
  }
  pauVar16 = (undefined1 (*) [16])(*pauVar14 + (long)(stride * 7) * 2);
  pauVar24 = pauVar12;
  if (bVar8 || !bVar25) {
    pauVar16 = (undefined1 (*) [16])input;
    pauVar24 = (undefined1 (*) [16])(*pauVar14 + (long)(stride * 7) * 2);
  }
  auVar26 = *pauVar24;
  pauVar24 = (undefined1 (*) [16])input;
  if (bVar8 || !bVar25) {
    pauVar24 = pauVar12;
  }
  uVar21 = (uint)*av1_fwd_txfm_shift_ls[7];
  if ((uVar10 & 1) == 0 && bVar25) {
    auVar28 = vpshufb_avx(*pauVar16,_DAT_00dcc090);
    local_500 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar17 * 2),_DAT_00dcc090);
    local_4e0 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar19 * 2),_DAT_00dcc090);
    local_4c0 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar22 * 2),_DAT_00dcc090);
    local_4a0 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar20 * 2),_DAT_00dcc090);
    local_480 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar7 * 2),_DAT_00dcc090);
    local_460 = vpmovsxwd_avx2(auVar28);
    auVar28 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar14 + (long)iVar6 * 2),_DAT_00dcc090);
    local_440 = vpmovsxwd_avx2(auVar28);
    auVar26 = vpshufb_avx(auVar26,_DAT_00dcc090);
  }
  else {
    local_500 = vpmovsxwd_avx2(*pauVar16);
    local_4e0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar17 * 2));
    local_4c0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar19 * 2));
    local_4a0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar22 * 2));
    local_480 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar20 * 2));
    local_460 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar7 * 2));
    local_440 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar14 + (long)iVar6 * 2));
  }
  pcVar1 = *(code **)((long)row_highbd_txfm8x8_arr + uVar23);
  bVar8 = (uVar15 & 1) != 0;
  iVar6 = iVar18;
  iVar17 = stride * 3;
  if (bVar8 || !bVar25) {
    iVar6 = stride * 3;
    iVar17 = iVar18;
  }
  iVar7 = stride * 5;
  if (bVar8 || !bVar25) {
    iVar7 = iVar13;
    iVar13 = stride * 5;
  }
  iVar22 = stride * 6;
  iVar19 = stride;
  if (bVar8 || !bVar25) {
    iVar22 = stride;
    iVar19 = stride * 6;
  }
  auVar31 = vpmovsxwd_avx2(auVar26);
  local_500 = vpslld_avx2(local_500,ZEXT416(uVar21));
  local_4e0 = vpslld_avx2(local_4e0,ZEXT416(uVar21));
  auVar26 = ZEXT416(uVar21);
  local_4c0 = vpslld_avx2(local_4c0,auVar26);
  local_4a0 = vpslld_avx2(local_4a0,auVar26);
  local_480 = vpslld_avx2(local_480,auVar26);
  local_460 = vpslld_avx2(local_460,auVar26);
  auVar26 = ZEXT416(uVar21);
  local_440 = vpslld_avx2(local_440,auVar26);
  local_420 = vpslld_avx2(auVar31,auVar26);
  pauVar14 = (undefined1 (*) [16])(*pauVar24 + (long)(stride * 7) * 2);
  if (!bVar8 && bVar25) {
    pauVar12 = pauVar14;
    pauVar14 = (undefined1 (*) [16])input;
  }
  auVar28 = *pauVar14;
  if ((uVar10 & 1) == 0 && bVar25) {
    auVar2 = vpshufb_avx(*pauVar12,_DAT_00dcc090);
    local_400 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar22 * 2),_DAT_00dcc090);
    local_3e0 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar7 * 2),_DAT_00dcc090);
    local_3c0 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar6 * 2),_DAT_00dcc090);
    local_3a0 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar17 * 2),_DAT_00dcc090);
    local_380 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar13 * 2),_DAT_00dcc090);
    local_360 = vpmovsxwd_avx2(auVar2);
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar24 + (long)iVar19 * 2),_DAT_00dcc090);
    local_340 = vpmovsxwd_avx2(auVar2);
    auVar28 = vpshufb_avx(auVar28,_DAT_00dcc090);
  }
  else {
    local_400 = vpmovsxwd_avx2(*pauVar12);
    local_3e0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar22 * 2));
    local_3c0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar7 * 2));
    local_3a0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar6 * 2));
    local_380 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar17 * 2));
    local_360 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar13 * 2));
    local_340 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar24 + (long)iVar19 * 2));
  }
  auVar31 = vpmovsxwd_avx2(auVar28);
  local_400 = vpslld_avx2(local_400,auVar26);
  local_3e0 = vpslld_avx2(local_3e0,auVar26);
  local_3c0 = vpslld_avx2(local_3c0,auVar26);
  local_3a0 = vpslld_avx2(local_3a0,auVar26);
  local_380 = vpslld_avx2(local_380,auVar26);
  local_360 = vpslld_avx2(local_360,auVar26);
  local_340 = vpslld_avx2(local_340,ZEXT416(uVar21));
  local_320 = vpslld_avx2(auVar31,ZEXT416(uVar21));
  (**(code **)((long)col_highbd_txfm8x16_arr + uVar23))(local_500,local_260,0xd,1,1);
  iVar13 = 1 << (~piVar9[1] & 0x1fU);
  auVar27._4_4_ = iVar13;
  auVar27._0_4_ = iVar13;
  auVar27._8_4_ = iVar13;
  auVar27._12_4_ = iVar13;
  auVar27._16_4_ = iVar13;
  auVar27._20_4_ = iVar13;
  auVar27._24_4_ = iVar13;
  auVar27._28_4_ = iVar13;
  auVar31 = vpaddd_avx2(auVar27,local_260);
  auVar30 = vpaddd_avx2(auVar27,local_240);
  auVar32 = vpaddd_avx2(auVar27,local_220);
  auVar34 = vpaddd_avx2(auVar27,local_200);
  auVar29 = vpaddd_avx2(auVar27,local_1e0);
  auVar3 = vpaddd_avx2(auVar27,local_1c0);
  auVar4 = vpaddd_avx2(auVar27,local_1a0);
  uVar10 = -(int)piVar9[1];
  auVar27 = vpaddd_avx2(auVar27,local_180);
  local_260 = vpsrad_avx2(auVar31,ZEXT416(uVar10));
  local_240 = vpsrad_avx2(auVar30,ZEXT416(uVar10));
  auVar26 = ZEXT416(uVar10);
  local_280 = vpsrad_avx2(auVar32,auVar26);
  local_200 = vpsrad_avx2(auVar34,auVar26);
  local_2a0 = vpsrad_avx2(auVar29,auVar26);
  local_1c0 = vpsrad_avx2(auVar3,auVar26);
  local_1a0 = vpsrad_avx2(auVar4,ZEXT416(uVar10));
  local_180 = vpsrad_avx2(auVar27,ZEXT416(uVar10));
  iVar13 = 1 << (~piVar9[1] & 0x1fU);
  auVar33._4_4_ = iVar13;
  auVar33._0_4_ = iVar13;
  auVar33._8_4_ = iVar13;
  auVar33._12_4_ = iVar13;
  auVar33._16_4_ = iVar13;
  auVar33._20_4_ = iVar13;
  auVar33._24_4_ = iVar13;
  auVar33._28_4_ = iVar13;
  auVar31 = vpaddd_avx2(auVar33,local_160);
  auVar30 = vpaddd_avx2(auVar33,local_140);
  auVar32 = vpaddd_avx2(auVar33,local_120);
  auVar34 = vpaddd_avx2(auVar33,local_100);
  auVar29 = vpaddd_avx2(auVar33,local_e0);
  auVar3 = vpaddd_avx2(auVar33,local_c0);
  uVar10 = -(int)piVar9[1];
  auVar4 = vpaddd_avx2(auVar33,local_a0);
  auVar27 = vpaddd_avx2(auVar33,local_80);
  local_2c0 = vpsrad_avx2(auVar31,ZEXT416(uVar10));
  local_2e0 = vpsrad_avx2(auVar30,ZEXT416(uVar10));
  auVar26 = ZEXT416(uVar10);
  local_300 = vpsrad_avx2(auVar32,auVar26);
  local_100 = vpsrad_avx2(auVar34,auVar26);
  local_e0 = vpsrad_avx2(auVar29,auVar26);
  local_c0 = vpsrad_avx2(auVar3,auVar26);
  local_a0 = vpsrad_avx2(auVar4,ZEXT416(uVar10));
  local_80 = vpsrad_avx2(auVar27,ZEXT416(uVar10));
  auVar29 = vpunpckldq_avx2(local_260,local_240);
  auVar31 = vpunpckhdq_avx2(local_260,local_240);
  auVar3 = vpunpckldq_avx2(local_280,local_200);
  auVar30 = vpunpckhdq_avx2(local_280,local_200);
  auVar4 = vpunpckldq_avx2(local_2a0,local_1c0);
  auVar32 = vpunpckhdq_avx2(local_2a0,local_1c0);
  auVar27 = vpunpckldq_avx2(local_1a0,local_180);
  auVar34 = vpunpckhdq_avx2(local_1a0,local_180);
  auVar33 = vpunpcklqdq_avx2(auVar29,auVar3);
  auVar5 = vpunpcklqdq_avx2(auVar4,auVar27);
  local_500._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar33._0_16_;
  local_500._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_400 = vperm2i128_avx2(auVar33,auVar5,0x31);
  auVar29 = vpunpckhqdq_avx2(auVar29,auVar3);
  auVar3 = vpunpckhqdq_avx2(auVar4,auVar27);
  local_4c0._0_16_ = ZEXT116(0) * auVar3._0_16_ + ZEXT116(1) * auVar29._0_16_;
  local_4c0._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar3._0_16_;
  local_3c0 = vperm2i128_avx2(auVar29,auVar3,0x31);
  auVar29 = vpunpcklqdq_avx2(auVar31,auVar30);
  auVar3 = vpunpcklqdq_avx2(auVar32,auVar34);
  local_480._0_16_ = ZEXT116(0) * auVar3._0_16_ + ZEXT116(1) * auVar29._0_16_;
  local_480._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar3._0_16_;
  local_380 = vperm2i128_avx2(auVar29,auVar3,0x31);
  auVar31 = vpunpckhqdq_avx2(auVar31,auVar30);
  auVar30 = vpunpckhqdq_avx2(auVar32,auVar34);
  local_440._0_16_ = ZEXT116(0) * auVar30._0_16_ + ZEXT116(1) * auVar31._0_16_;
  local_440._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar30._0_16_;
  local_340 = vperm2i128_avx2(auVar31,auVar30,0x31);
  auVar29 = vpunpckldq_avx2(local_2c0,local_2e0);
  auVar31 = vpunpckhdq_avx2(local_2c0,local_2e0);
  auVar3 = vpunpckldq_avx2(local_300,local_100);
  auVar30 = vpunpckhdq_avx2(local_300,local_100);
  auVar4 = vpunpckldq_avx2(local_e0,local_c0);
  auVar32 = vpunpckhdq_avx2(local_e0,local_c0);
  auVar27 = vpunpckldq_avx2(local_a0,local_80);
  auVar34 = vpunpckhdq_avx2(local_a0,local_80);
  auVar33 = vpunpcklqdq_avx2(auVar29,auVar3);
  auVar5 = vpunpcklqdq_avx2(auVar4,auVar27);
  local_4e0._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar33._0_16_;
  local_4e0._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_3e0 = vperm2i128_avx2(auVar33,auVar5,0x31);
  auVar29 = vpunpckhqdq_avx2(auVar29,auVar3);
  auVar3 = vpunpckhqdq_avx2(auVar4,auVar27);
  local_4a0._0_16_ = ZEXT116(0) * auVar3._0_16_ + ZEXT116(1) * auVar29._0_16_;
  local_4a0._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar3._0_16_;
  local_3a0 = vperm2i128_avx2(auVar29,auVar3,0x31);
  auVar29 = vpunpcklqdq_avx2(auVar31,auVar30);
  auVar3 = vpunpcklqdq_avx2(auVar32,auVar34);
  local_460._0_16_ = ZEXT116(0) * auVar3._0_16_ + ZEXT116(1) * auVar29._0_16_;
  local_460._16_16_ = ZEXT116(0) * auVar29._16_16_ + ZEXT116(1) * auVar3._0_16_;
  local_360 = vperm2i128_avx2(auVar29,auVar3,0x31);
  auVar31 = vpunpckhqdq_avx2(auVar31,auVar30);
  auVar30 = vpunpckhqdq_avx2(auVar32,auVar34);
  local_420._0_16_ = ZEXT116(0) * auVar30._0_16_ + ZEXT116(1) * auVar31._0_16_;
  local_420._16_16_ = ZEXT116(0) * auVar31._16_16_ + ZEXT116(1) * auVar30._0_16_;
  local_320 = vperm2i128_avx2(auVar31,auVar30,0x31);
  local_220 = local_280;
  local_1e0 = local_2a0;
  local_160 = local_2c0;
  local_140 = local_2e0;
  local_120 = local_300;
  (*pcVar1)(local_500,local_260,0xd,2,2);
  uVar10 = (uint)piVar9[2];
  if ((int)uVar10 < 0) {
    iVar13 = 1 << (~piVar9[2] & 0x1fU);
    auVar31._4_4_ = iVar13;
    auVar31._0_4_ = iVar13;
    auVar31._8_4_ = iVar13;
    auVar31._12_4_ = iVar13;
    auVar31._16_4_ = iVar13;
    auVar31._20_4_ = iVar13;
    auVar31._24_4_ = iVar13;
    auVar31._28_4_ = iVar13;
    lVar11 = 0;
    auVar30._8_4_ = 0x16a1;
    auVar30._0_8_ = 0x16a1000016a1;
    auVar30._12_4_ = 0x16a1;
    auVar30._16_4_ = 0x16a1;
    auVar30._20_4_ = 0x16a1;
    auVar30._24_4_ = 0x16a1;
    auVar30._28_4_ = 0x16a1;
    auVar32._8_4_ = 0x800;
    auVar32._0_8_ = 0x80000000800;
    auVar32._12_4_ = 0x800;
    auVar32._16_4_ = 0x800;
    auVar32._20_4_ = 0x800;
    auVar32._24_4_ = 0x800;
    auVar32._28_4_ = 0x800;
    do {
      auVar34 = vpaddd_avx2(auVar31,*(undefined1 (*) [32])(local_260 + lVar11));
      auVar34 = vpsrad_avx2(auVar34,ZEXT416(-uVar10));
      auVar34 = vpmulld_avx2(auVar34,auVar30);
      auVar34 = vpaddd_avx2(auVar34,auVar32);
      auVar34 = vpsrad_avx2(auVar34,0xc);
      *(undefined1 (*) [32])(local_500 + lVar11) = auVar34;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x200);
  }
  else {
    lVar11 = 0;
    auVar34._8_4_ = 0x16a1;
    auVar34._0_8_ = 0x16a1000016a1;
    auVar34._12_4_ = 0x16a1;
    auVar34._16_4_ = 0x16a1;
    auVar34._20_4_ = 0x16a1;
    auVar34._24_4_ = 0x16a1;
    auVar34._28_4_ = 0x16a1;
    auVar29._8_4_ = 0x800;
    auVar29._0_8_ = 0x80000000800;
    auVar29._12_4_ = 0x800;
    auVar29._16_4_ = 0x800;
    auVar29._20_4_ = 0x800;
    auVar29._24_4_ = 0x800;
    auVar29._28_4_ = 0x800;
    do {
      auVar31 = vpslld_avx2(*(undefined1 (*) [32])(local_260 + lVar11),ZEXT416(uVar10));
      auVar31 = vpmulld_avx2(auVar31,auVar34);
      auVar31 = vpaddd_avx2(auVar31,auVar29);
      auVar31 = vpsrad_avx2(auVar31,0xc);
      *(undefined1 (*) [32])(local_500 + lVar11) = auVar31;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x200);
  }
  memcpy(coeff,local_500,0x200);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16_avx2(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, out, bit, 1, 1);
  col_txfm_8x8_rounding(out, -shift[1]);
  col_txfm_8x8_rounding(&out[8], -shift[1]);
  fwd_txfm_transpose_8x8_avx2(out, in, 1, 2);
  fwd_txfm_transpose_8x8_avx2(&out[8], &in[1], 1, 2);
  row_txfm(in, out, bit, 2, 2);
  round_shift_rect_array_32_avx2(out, in, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(in, coeff, 8, 16);
  (void)bd;
}